

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::FileDescriptor::FileDescriptor(FileDescriptor *this,FileDescriptor *rhs)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UL *pUVar3;
  MDDEntry *pMVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  InterchangeObject::InterchangeObject
            ((InterchangeObject *)this,(rhs->super_GenericDescriptor).super_InterchangeObject.m_Dict
            );
  (this->super_GenericDescriptor).Locators.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_GenericDescriptor).Locators.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_GenericDescriptor).Locators.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_GenericDescriptor).Locators.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_00222a50;
  (this->super_GenericDescriptor).SubDescriptors.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_GenericDescriptor).SubDescriptors.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_GenericDescriptor).SubDescriptors.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_GenericDescriptor).SubDescriptors.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_00222a50;
  (this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__FileDescriptor_002237f0;
  (this->LinkedTrackID).m_has_value = false;
  (this->SampleRate).super_Rational.Numerator = 0;
  (this->SampleRate).super_Rational.Denominator = 0;
  (this->SampleRate).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00222760;
  (this->ContainerDuration).m_has_value = false;
  (this->EssenceContainer).super_Identifier<16U>.m_HasValue = false;
  (this->EssenceContainer).super_Identifier<16U>.m_Value[0] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[1] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[2] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[3] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[4] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[5] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->EssenceContainer;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->EssenceContainer).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  (this->Codec).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->Codec).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &(this->Codec).m_property;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->Codec).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  (this->Codec).m_has_value = false;
  this_00 = (this->super_GenericDescriptor).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_FileDescriptor);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
    super_Identifier<16U>.m_HasValue = true;
    local_28 = (undefined4)uVar1;
    uStack_24 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_20 = (undefined4)uVar2;
    uStack_1c = (undefined4)((ulong)uVar2 >> 0x20);
    *(undefined4 *)
     (this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
     super_Identifier<16U>.m_Value = local_28;
    *(undefined4 *)
     ((this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 4) = uStack_24;
    *(undefined4 *)
     ((this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 8) = uStack_20;
    *(undefined4 *)
     ((this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 0xc) = uStack_1c;
    (*(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket[0x14])
              (this,rhs);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x55e,"ASDCP::MXF::FileDescriptor::FileDescriptor(const FileDescriptor &)");
}

Assistant:

FileDescriptor::FileDescriptor(const FileDescriptor& rhs) : GenericDescriptor(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_FileDescriptor);
  Copy(rhs);
}